

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packets.c
# Opt level: O0

int rtr_sync_update_tables
              (rtr_socket *rtr_socket,pfx_table *pfx_table,spki_table *spki_table,
              aspa_table *aspa_table,pdu_ipv4 *ipv4_pdus,uint ipv4_pdu_count,pdu_ipv6 *ipv6_pdus,
              uint ipv6_pdu_count,pdu_router_key *router_key_pdus,uint router_key_pdu_count,
              pdu_aspa **aspa_pdus,size_t aspa_pdu_count,pdu_end_of_data_v0 *eod_pdu)

{
  bool bVar1;
  int iVar2;
  long in_FS_OFFSET;
  bool bVar3;
  ulong local_68;
  size_t i_2;
  size_t i_1;
  size_t i;
  _Bool undo_failed;
  _Bool proceed;
  uint ipv4_pdu_count_local;
  pdu_ipv4 *ipv4_pdus_local;
  aspa_table *aspa_table_local;
  spki_table *spki_table_local;
  pfx_table *pfx_table_local;
  rtr_socket *rtr_socket_local;
  aspa_update *local_18;
  aspa_update *aspa_update;
  
  aspa_update = *(aspa_update **)(in_FS_OFFSET + 0x28);
  bVar1 = true;
  bVar3 = false;
  local_18 = (aspa_update *)0x0;
  for (i_1 = 0; i_1 < ipv4_pdu_count; i_1 = i_1 + 1) {
    iVar2 = rtr_update_pfx_table(rtr_socket,pfx_table,ipv4_pdus + i_1);
    if (iVar2 == -1) {
      lrtr_dbg("RTR Socket: error while updating v4 prefixes");
      bVar1 = false;
      iVar2 = rtr_undo_update_pfx_table_batch(rtr_socket,pfx_table,ipv4_pdus,i_1,ipv6_pdus,0);
      bVar3 = iVar2 == -1;
      break;
    }
  }
  if (bVar1) {
    lrtr_dbg("RTR Socket: v4 prefixes added");
    for (i_2 = 0; i_2 < ipv6_pdu_count; i_2 = i_2 + 1) {
      iVar2 = rtr_update_pfx_table(rtr_socket,pfx_table,ipv6_pdus + i_2);
      if (iVar2 == -1) {
        lrtr_dbg("RTR Socket: error while updating v6 prefixes");
        bVar1 = false;
        iVar2 = rtr_undo_update_pfx_table_batch
                          (rtr_socket,pfx_table,ipv4_pdus,(ulong)ipv4_pdu_count,ipv6_pdus,i_2);
        if (iVar2 == -1) {
          bVar3 = true;
        }
        break;
      }
    }
  }
  if (bVar1) {
    lrtr_dbg("RTR Socket: v6 prefixes added");
    for (local_68 = 0; local_68 < router_key_pdu_count; local_68 = local_68 + 1) {
      iVar2 = rtr_update_spki_table(rtr_socket,spki_table,router_key_pdus + local_68);
      if (iVar2 == -1) {
        lrtr_dbg("RTR Socket: error while updating spki data");
        bVar1 = false;
        iVar2 = rtr_undo_update_spki_table_batch(rtr_socket,spki_table,router_key_pdus,local_68);
        if (iVar2 == -1) {
          bVar3 = true;
        }
        iVar2 = rtr_undo_update_pfx_table_batch
                          (rtr_socket,pfx_table,ipv4_pdus,(ulong)ipv4_pdu_count,ipv6_pdus,
                           (ulong)ipv6_pdu_count);
        if (iVar2 == -1) {
          bVar3 = true;
        }
        break;
      }
    }
  }
  if (bVar1) {
    lrtr_dbg("RTR Socket: spki data added");
    iVar2 = rtr_compute_update_aspa_table(rtr_socket,aspa_table,aspa_pdus,aspa_pdu_count,&local_18);
    if (iVar2 == -1) {
      lrtr_dbg("RTR Socket: error while computing ASPA update");
      bVar1 = false;
      iVar2 = rtr_undo_update_spki_table_batch
                        (rtr_socket,spki_table,router_key_pdus,(ulong)router_key_pdu_count);
      if (iVar2 == -1) {
        bVar3 = true;
      }
      iVar2 = rtr_undo_update_pfx_table_batch
                        (rtr_socket,pfx_table,ipv4_pdus,(ulong)ipv4_pdu_count,ipv6_pdus,
                         (ulong)ipv6_pdu_count);
      if (iVar2 == -1) {
        bVar3 = true;
      }
    }
  }
  if (bVar1) {
    aspa_table_update_swap_in_apply(&local_18);
    lrtr_dbg("RTR Socket: ASPA data added");
    rtr_socket->serial_number = eod_pdu->sn;
    lrtr_dbg("RTR Socket: Sync successful, received %u Prefix PDUs, %u Router Key PDUs, %lu ASPA PDUs, session_id: %u, SN: %u"
             ,(ulong)(ipv4_pdu_count + ipv6_pdu_count),(ulong)router_key_pdu_count,aspa_pdu_count,
             (ulong)rtr_socket->session_id,(ulong)rtr_socket->serial_number);
    rtr_socket_local._4_4_ = 0;
  }
  else {
    aspa_table_update_swap_in_discard(&local_18);
    if (bVar3) {
      rtr_socket->request_session_id = true;
    }
    rtr_change_socket_state(rtr_socket,RTR_ERROR_FATAL);
    rtr_socket_local._4_4_ = -1;
  }
  if (*(aspa_update **)(in_FS_OFFSET + 0x28) == aspa_update) {
    return rtr_socket_local._4_4_;
  }
  __stack_chk_fail();
}

Assistant:

static int rtr_sync_update_tables(struct rtr_socket *rtr_socket, struct pfx_table *pfx_table,
				  struct spki_table *spki_table, struct aspa_table *aspa_table,
				  struct pdu_ipv4 *ipv4_pdus, const unsigned int ipv4_pdu_count,
				  struct pdu_ipv6 *ipv6_pdus, const unsigned int ipv6_pdu_count,
				  struct pdu_router_key *router_key_pdus, const unsigned int router_key_pdu_count,
				  struct pdu_aspa **aspa_pdus, const size_t aspa_pdu_count,
				  struct pdu_end_of_data_v0 *eod_pdu)
{
	bool proceed = true;
	bool undo_failed = false;
#if ASPA_UPDATE_MECHANISM == ASPA_SWAP_IN
	struct aspa_update *aspa_update = NULL;
#elif ASPA_UPDATE_MECHANISM == ASPA_IN_PLACE
	struct aspa_update_operation *aspa_failed_operation = NULL;
	struct aspa_update_operation *aspa_operations = NULL;
#else
#error "Invalid ASPA_UPDATE_MECHANISM value."
#endif /* ASPA_UPDATE_MECHANISM */

	// add all IPv4 prefix pdu to the pfx_table
	for (size_t i = 0; i < ipv4_pdu_count; i++) {
		if (rtr_update_pfx_table(rtr_socket, pfx_table, &(ipv4_pdus[i])) == RTR_ERROR) {
			RTR_DBG1("error while updating v4 prefixes");
			proceed = false;

			if (rtr_undo_update_pfx_table_batch(rtr_socket, pfx_table, ipv4_pdus, i, ipv6_pdus, 0) ==
			    RTR_ERROR)
				undo_failed = true;

			break;
		}
	}

	if (proceed) {
		RTR_DBG1("v4 prefixes added");

		// add all IPv6 prefix pdu to the pfx_table
		for (size_t i = 0; i < ipv6_pdu_count; i++) {
			if (rtr_update_pfx_table(rtr_socket, pfx_table, &(ipv6_pdus[i])) == RTR_ERROR) {
				RTR_DBG1("error while updating v6 prefixes");
				proceed = false;

				if (rtr_undo_update_pfx_table_batch(rtr_socket, pfx_table, ipv4_pdus, ipv4_pdu_count,
								    ipv6_pdus, i) == RTR_ERROR)
					undo_failed = true;

				break;
			}
		}
	}

	if (proceed) {
		RTR_DBG1("v6 prefixes added");

		// add all router key pdu to the spki_table
		for (size_t i = 0; i < router_key_pdu_count; i++) {
			if (rtr_update_spki_table(rtr_socket, spki_table, &(router_key_pdus[i])) == RTR_ERROR) {
				RTR_DBG1("error while updating spki data");
				proceed = false;

				if (rtr_undo_update_spki_table_batch(rtr_socket, spki_table, router_key_pdus, i) ==
				    RTR_ERROR)
					undo_failed = true;

				if (rtr_undo_update_pfx_table_batch(rtr_socket, pfx_table, ipv4_pdus, ipv4_pdu_count,
								    ipv6_pdus, ipv6_pdu_count) == RTR_ERROR)
					undo_failed = true;

				break;
			}
		}
	}

#if ASPA_UPDATE_MECHANISM == ASPA_SWAP_IN
	if (proceed) {
		RTR_DBG1("spki data added");

		if (rtr_compute_update_aspa_table(rtr_socket, aspa_table, aspa_pdus, aspa_pdu_count, &aspa_update) ==
		    RTR_ERROR) {
			RTR_DBG1("error while computing ASPA update");
			proceed = false;

			if (rtr_undo_update_spki_table_batch(rtr_socket, spki_table, router_key_pdus,
							     router_key_pdu_count) == RTR_ERROR)
				undo_failed = true;

			if (rtr_undo_update_pfx_table_batch(rtr_socket, pfx_table, ipv4_pdus, ipv4_pdu_count, ipv6_pdus,
							    ipv6_pdu_count) == RTR_ERROR)
				undo_failed = true;
		}
	}

	if (proceed) {
		aspa_table_update_swap_in_apply(&aspa_update);
		RTR_DBG1("ASPA data added");
	} else {
		aspa_table_update_swap_in_discard(&aspa_update);
	}

#elif ASPA_UPDATE_MECHANISM == ASPA_IN_PLACE
	if (proceed) {
		RTR_DBG1("spki data added");

		if (rtr_update_aspa_table(rtr_socket, aspa_table, aspa_pdus, aspa_pdu_count, &aspa_operations,
					  &aspa_failed_operation) == RTR_ERROR) {
			RTR_DBG1("error while updating ASPA data");
			proceed = false;

			if (rtr_undo_update_aspa_table(rtr_socket, aspa_table, aspa_operations, aspa_pdu_count,
						       aspa_failed_operation) == RTR_ERROR)
				undo_failed = true;

			if (rtr_undo_update_spki_table_batch(rtr_socket, spki_table, router_key_pdus,
							     router_key_pdu_count) == RTR_ERROR)
				undo_failed = true;

			if (rtr_undo_update_pfx_table_batch(rtr_socket, pfx_table, ipv4_pdus, ipv4_pdu_count, ipv6_pdus,
							    ipv6_pdu_count) == RTR_ERROR)
				undo_failed = true;
		}
	}

	if (proceed)
		RTR_DBG1("ASPA data added");

	aspa_table_update_in_place_cleanup(&aspa_operations, aspa_pdu_count);
	aspa_failed_operation = NULL;
#else
#error "Invalid ASPA_UPDATE_MECHANISM value."
#endif /* ASPA_UPDATE_MECHANISM */

	// An update attempted above failed
	if (!proceed) {
		if (undo_failed)
			// undo failed, so request new session
			rtr_socket->request_session_id = true;

		rtr_change_socket_state(rtr_socket, RTR_ERROR_FATAL);
		return RTR_ERROR;
	}

	rtr_socket->serial_number = eod_pdu->sn;
	RTR_DBG("Sync successful, received %u Prefix PDUs, %u Router Key PDUs, %lu ASPA PDUs, session_id: %u, SN: %u",
		(ipv4_pdu_count + ipv6_pdu_count), router_key_pdu_count, aspa_pdu_count, rtr_socket->session_id,
		rtr_socket->serial_number);

	return RTR_SUCCESS;
}